

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sectoraction.cpp
# Opt level: O3

void __thiscall ASectorAction::Destroy(ASectorAction *this)

{
  ActorFlags *pAVar1;
  AActor **ppAVar2;
  sector_t *psVar3;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar7;
  
  psVar3 = (this->super_AActor).Sector;
  if (psVar3 == (sector_t *)0x0) {
    AActor::ClearRenderSectorList(&this->super_AActor);
    AActor::ClearRenderLineList(&this->super_AActor);
    AActor::DestroyAllInventory(&this->super_AActor);
    if (((this->super_AActor).tid != 0) &&
       (ppAVar2 = (this->super_AActor).iprev, ppAVar2 != (AActor **)0x0)) {
      pAVar6 = (this->super_AActor).inext;
      *ppAVar2 = pAVar6;
      if (pAVar6 != (AActor *)0x0) {
        pAVar6->iprev = (this->super_AActor).iprev;
      }
      (this->super_AActor).inext = (AActor *)0x0;
      (this->super_AActor).iprev = (AActor **)0x0;
    }
    (this->super_AActor).tid = 0;
    AActor::UnlinkFromWorld(&this->super_AActor,(FLinkContext *)0x0);
    pAVar1 = &(this->super_AActor).flags;
    *(byte *)&pAVar1->Value = (byte)pAVar1->Value | 0x18;
    S_RelinkSound(&this->super_AActor,(AActor *)0x0);
    DThinker::Destroy((DThinker *)this);
    return;
  }
  pAVar6 = &((psVar3->SecActTarget).field_0.p)->super_AActor;
  if (pAVar6 == (AActor *)0x0) goto LAB_004b9ecb;
  if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (psVar3->SecActTarget).field_0.p = (ASectorAction *)0x0;
    goto LAB_004b9ecb;
  }
  if (pAVar6 == &this->super_AActor) {
    paVar4 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)&psVar3->SecActTarget;
  }
  else {
    do {
      pAVar5 = pAVar6;
      pAVar6 = (pAVar5->tracer).field_0.p;
      if (pAVar6 == (AActor *)0x0) goto LAB_004b9ecb;
      if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (pAVar5->tracer).field_0.p = (AActor *)0x0;
        goto LAB_004b9ecb;
      }
    } while (pAVar6 != &this->super_AActor);
    paVar4 = &(pAVar5->tracer).field_0;
  }
  aVar7 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)(pAVar6->tracer).field_0.p;
  if (aVar7.p == (AActor *)0x0) {
LAB_004b9eb9:
    aVar7.p = (AActor *)0x0;
  }
  else if ((((aVar7.p)->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (pAVar6->tracer).field_0.p = (AActor *)0x0;
    goto LAB_004b9eb9;
  }
  paVar4->p = (AActor *)aVar7;
LAB_004b9ecb:
  (this->super_AActor).Sector = (sector_t *)0x0;
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ASectorAction::Destroy ()
{
	if (Sector != nullptr)
	{
		// Remove ourself from this sector's list of actions
		AActor *probe = Sector->SecActTarget;
		union
		{
			AActor **act;
			ASectorAction **secact;
		} prev;
		prev.secact = &Sector->SecActTarget;

		while (probe && probe != this)
		{
			prev.act = &probe->tracer;
			probe = probe->tracer;
		}
		if (probe != nullptr)
		{
			*prev.act = probe->tracer;
		}
		Sector = nullptr;
	}

	Super::Destroy ();
}